

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O2

void grpc_go_generator::anon_unknown_0::GenerateService
               (Service *service,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var1;
  CommentHolder *pCVar2;
  undefined8 uVar3;
  Service *pSVar4;
  _Base_ptr *pp_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _func_int *p_Var13;
  int i;
  uint uVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *pcVar16;
  allocator<char> local_3c1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3c0;
  allocator<char> local_3b3;
  allocator<char> local_3b2;
  allocator<char> local_3b1;
  CommentHolder *local_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  Service *local_318;
  uint local_310;
  allocator<char> local_30a;
  allocator<char> local_309;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  int local_2d8;
  int local_2d4;
  key_type local_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  string local_250;
  key_type local_230;
  _Base_ptr *local_200;
  size_type local_1f8;
  CommentHolder local_1f0;
  undefined8 uStack_1e8;
  key_type local_1e0;
  string local_1c0;
  string local_1a0;
  key_type local_180;
  string local_160;
  string local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_318 = service;
  (*(service->super_CommentHolder)._vptr_CommentHolder[6])(&local_1a0);
  exportName((string *)&local_3a8,&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"Service",(allocator<char> *)&local_378);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](vars,(key_type *)&local_348);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_1a0);
  (*printer->_vptr_Printer[2])(printer,vars,"// Client API for $Service$ service\n");
  (*printer->_vptr_Printer[2])(printer,vars,"type $Service$Client interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"Ending",(allocator<char> *)&local_348);
  local_3c0 = &vars->_M_t;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](vars,(key_type *)&local_3a8);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&local_3a8);
  for (uVar14 = 0; pSVar4 = local_318,
      iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318),
      (int)uVar14 < iVar10; uVar14 = uVar14 + 1) {
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])
              ((string *)&local_3a8,pSVar4,(ulong)uVar14);
    uVar3 = local_3a8._M_impl._0_8_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_60,local_3c0);
    GenerateClientMethodSignature
              ((Method *)uVar3,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    if ((CommentHolder *)local_3a8._M_impl._0_8_ != (CommentHolder *)0x0) {
      (*(*(_func_int ***)local_3a8._M_impl._0_8_)[1])();
    }
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"Service",(allocator<char> *)&local_280);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3c0,(key_type *)&local_348);
  std::__cxx11::string::string((string *)&local_200,(string *)pmVar11);
  pp_Var5 = local_200;
  if (local_1f8 != 0) {
    iVar10 = tolower((int)*(char *)local_200);
    *(char *)pp_Var5 = (char)iVar10;
  }
  local_3a8._M_impl._0_8_ = &local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((CommentHolder *)local_200 == &local_1f0) {
    local_3a8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uStack_1e8;
  }
  else {
    local_3a8._M_impl._0_8_ = local_200;
  }
  local_3a8._M_impl.super__Rb_tree_header._M_header._0_8_ = local_1f8;
  local_1f8 = 0;
  local_1f0._vptr_CommentHolder._0_1_ = 0;
  local_200 = (_Base_ptr *)&local_1f0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"ServiceUnexported",(allocator<char> *)&local_308);
  p_Var1 = local_3c0;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3c0,(key_type *)&local_378);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_348);
  (*printer->_vptr_Printer[2])(printer,p_Var1,"type $ServiceUnexported$Client struct {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var1,"cc $grpc$.ClientConnInterface\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,p_Var1,
             "func New$Service$Client(cc $grpc$.ClientConnInterface) $Service$Client {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var1,"return &$ServiceUnexported$Client{cc}");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"\n}\n\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Service",(allocator<char> *)&local_308);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var1,(key_type *)&local_378);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,"_"
                 ,pmVar11);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                 "_serviceDesc");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"ServiceDesc",(allocator<char> *)&local_2b0);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_3c0,(key_type *)&local_280);
  std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_378);
  local_2d4 = 0;
  local_2d8 = 0;
  uVar14 = 0;
  while (pSVar4 = local_318,
        iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318),
        p_Var1 = local_3c0, (int)uVar14 < iVar10) {
    local_310 = uVar14;
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])(&local_3b0,pSVar4,(ulong)uVar14);
    iVar10 = (*((CommentHolder *)&local_3b0->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])();
    if ((char)iVar10 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"ServiceDesc",(allocator<char> *)&local_230);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_3c0,(key_type *)&local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378
                     ,pmVar11,".Streams[");
      as_string<int>((string *)&local_308,local_2d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_378,(string *)&local_308);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_348,"]");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"MethodDesc",(allocator<char> *)&local_250);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_3c0,(key_type *)&local_2b0);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_280);
      local_2d8 = local_2d8 + 1;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"ServiceDesc",(allocator<char> *)&local_230);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_3c0,(key_type *)&local_280);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378
                     ,pmVar11,".Method[");
      as_string<int>((string *)&local_308,local_2d4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_378,(string *)&local_308);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_348,"]");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"MethodDesc",(allocator<char> *)&local_250);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_3c0,(key_type *)&local_2b0);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_280);
      local_2d4 = local_2d4 + 1;
    }
    pCVar2 = local_3b0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_90,local_3c0);
    (*printer->_vptr_Printer[2])(printer,&local_90,"func (c *$ServiceUnexported$Client) ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"Ending",(allocator<char> *)&local_348);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,(key_type *)&local_3a8);
    std::__cxx11::string::assign((char *)pmVar11);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_3a8,&local_90);
    GenerateClientMethodSignature
              ((Method *)pCVar2,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_3a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_3a8);
    (*printer->_vptr_Printer[5])(printer);
    (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[5])(&local_250,pCVar2);
    exportName((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
               &local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"Method",(allocator<char> *)&local_280);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,(key_type *)&local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"CustomMethodIO",(allocator<char> *)&local_308);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,(key_type *)&local_378);
    bVar6 = std::operator==(pmVar11,"");
    if (bVar6) {
      (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0xb])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                 pCVar2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"CustomMethodIO",&local_30a);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_90,&local_180);
      std::__cxx11::string::string((string *)&local_348,(string *)pmVar11);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"Request",(allocator<char> *)&local_2b0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,(key_type *)&local_280);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_348);
    if (!bVar6) {
      std::__cxx11::string::~string((string *)&local_180);
    }
    std::__cxx11::string::~string((string *)&local_378);
    (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0xd])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
               pCVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"Response",(allocator<char> *)&local_280);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,(key_type *)&local_378);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"ServicePrefix",&local_3b1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,(key_type *)&local_2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "/",pmVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Service",&local_3c1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,&local_230);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280,
                   "/");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Method",&local_3b3);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,&local_2d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   pmVar11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"FullMethodName",&local_3b2);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_90,&local_1e0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2b0);
    iVar10 = (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])(pCVar2);
    if ((char)iVar10 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"ServiceUnexported",(allocator<char> *)&local_230);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_90,(key_type *)&local_280);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"Method",(allocator<char> *)&local_2d0);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_90,(key_type *)&local_308);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378
                     ,pmVar11,pmVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_378,"Client");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"StreamType",(allocator<char> *)&local_1e0);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_90,(key_type *)&local_2b0);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_280);
      (*printer->_vptr_Printer[2])
                (printer,&local_90,
                 "stream, err := c.cc.NewStream(ctx, &$MethodDesc$, \"$FullMethodName$\", opts...)\n"
                );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"Error_Check",(allocator<char> *)&local_378);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_90,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_348);
      std::__cxx11::string::assign((char *)pmVar11);
      std::__cxx11::string::~string((string *)&local_348);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_348,&local_90);
      GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_348,true);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_348);
      (*printer->_vptr_Printer[2])(printer,&local_90,"x := &$StreamType${stream}\n");
      bVar6 = ServerOnlyStreaming((Method *)pCVar2);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"Error_Check",(allocator<char> *)&local_280);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,(key_type *)&local_378);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_378);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_378,&local_90);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_378,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_378);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"Error_Check",(allocator<char> *)&local_308);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,(key_type *)&local_280);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_280);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_280,&local_90);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_280,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_280);
      }
      (*printer->_vptr_Printer[3])(printer,"return x, nil\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
      iVar10 = (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])(pCVar2)
      ;
      bVar6 = true;
      if ((char)iVar10 == '\0') {
        bVar6 = ClientOnlyStreaming((Method *)pCVar2);
      }
      iVar10 = (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])(pCVar2)
      ;
      bVar7 = true;
      if ((char)iVar10 == '\0') {
        bVar7 = ServerOnlyStreaming((Method *)pCVar2);
      }
      bVar8 = ClientOnlyStreaming((Method *)pCVar2);
      (*printer->_vptr_Printer[2])(printer,&local_90,"type $Service$_$Method$Client interface {\n");
      (*printer->_vptr_Printer[5])(printer);
      if (bVar6 != false) {
        (*printer->_vptr_Printer[2])(printer,&local_90,"Send(*$Request$) error\n");
      }
      if (bVar7 != false) {
        (*printer->_vptr_Printer[2])(printer,&local_90,"Recv() (*$Response$, error)\n");
      }
      if (bVar8) {
        (*printer->_vptr_Printer[2])(printer,&local_90,"CloseAndRecv() (*$Response$, error)\n");
      }
      (*printer->_vptr_Printer[2])(printer,&local_90,"$grpc$.ClientStream\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
      (*printer->_vptr_Printer[2])(printer,&local_90,"type $StreamType$ struct {\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])(printer,&local_90,"$grpc$.ClientStream\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
      if (bVar6 != false) {
        (*printer->_vptr_Printer[2])
                  (printer,&local_90,"func (x *$StreamType$) Send(m *$Request$) error {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[3])(printer,"return x.ClientStream.SendMsg(m)\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
      }
      if (bVar7 != false) {
        (*printer->_vptr_Printer[2])
                  (printer,&local_90,"func (x *$StreamType$) Recv() (*$Response$, error) {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_90,"m := new($Response$)\n");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308,"Error_Check",(allocator<char> *)&local_2b0);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,(key_type *)&local_308);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_308);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_308,&local_90);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_308,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_308);
        (*printer->_vptr_Printer[3])(printer,"return m, nil\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
      }
      if (bVar8) {
        (*printer->_vptr_Printer[2])
                  (printer,&local_90,
                   "func (x *$StreamType$) CloseAndRecv() (*$Response$, error) {\n");
        (*printer->_vptr_Printer[5])(printer);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"Error_Check",(allocator<char> *)&local_230);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,(key_type *)&local_2b0);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_2b0,&local_90);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_2b0,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_2b0);
        (*printer->_vptr_Printer[2])(printer,&local_90,"m := new($Response$)\n");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"Error_Check",(allocator<char> *)&local_2d0);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_90,&local_230);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_230);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_230,&local_90);
        this = &local_230;
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this,true);
        pcVar16 = "return m, nil\n";
        goto LAB_0024c1ae;
      }
    }
    else {
      (*printer->_vptr_Printer[2])(printer,&local_90,"out := new($Response$)\n");
      (*printer->_vptr_Printer[2])
                (printer,&local_90,
                 "err := c.cc.Invoke(ctx, \"$FullMethodName$\", in, out, opts...)\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"Error_Check",(allocator<char> *)&local_378);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_90,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_348);
      std::__cxx11::string::assign((char *)pmVar11);
      std::__cxx11::string::~string((string *)&local_348);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_348,&local_90);
      GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_348,true);
      pcVar16 = "return out, nil\n";
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348;
LAB_0024c1ae:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
      (*printer->_vptr_Printer[3])(printer,pcVar16);
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    if (local_3b0 != (CommentHolder *)0x0) {
      (*((CommentHolder *)&local_3b0->_vptr_CommentHolder)->_vptr_CommentHolder[1])();
    }
    uVar14 = local_310 + 1;
  }
  (*printer->_vptr_Printer[2])(printer,local_3c0,"// Server API for $Service$ service\n");
  (*printer->_vptr_Printer[2])(printer,p_Var1,"type $Service$Server interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"Ending",(allocator<char> *)&local_348);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var1,(key_type *)&local_3a8);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&local_3a8);
  for (uVar14 = 0; pSVar4 = local_318,
      iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318),
      p_Var1 = local_3c0, (int)uVar14 < iVar10; uVar14 = uVar14 + 1) {
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])
              ((string *)&local_3a8,pSVar4,(ulong)uVar14);
    uVar3 = local_3a8._M_impl._0_8_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_c0,local_3c0);
    GenerateServerMethodSignature
              ((Method *)uVar3,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_c0);
    if ((_Base_ptr *)local_3a8._M_impl._0_8_ != (_Base_ptr *)0x0) {
      (*(*(_func_int ***)local_3a8._M_impl._0_8_)[1])();
    }
  }
  (*printer->_vptr_Printer[2])(printer,local_3c0,"mustEmbedUnimplemented$Service$Server()\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])(printer,p_Var1,"type Unimplemented$Service$Server struct {\n");
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"Ending",(allocator<char> *)&local_348);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)p_Var1,(key_type *)&local_3a8);
  std::__cxx11::string::assign((char *)pmVar11);
  std::__cxx11::string::~string((string *)&local_3a8);
  for (uVar14 = 0; pSVar4 = local_318,
      iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318),
      p_Var1 = local_3c0, (int)uVar14 < iVar10; uVar14 = uVar14 + 1) {
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])(&local_378,pSVar4,(ulong)uVar14);
    (*(*(_func_int ***)local_378._M_impl._0_8_)[5])(&local_1c0);
    exportName((string *)&local_3a8,&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Method",(allocator<char> *)&local_280);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,(key_type *)&local_348);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_1c0);
    (**(code **)((long)*(CommentHolder *)local_378._M_impl._0_8_ + 0x78))();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"Nil",(allocator<char> *)&local_348);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,(string *)&local_3a8);
    std::__cxx11::string::assign((char *)pmVar11);
    std::__cxx11::string::~string((string *)&local_3a8);
    (*printer->_vptr_Printer[2])(printer,local_3c0,"func (Unimplemented$Service$Server) ");
    uVar3 = local_378._M_impl._0_8_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_f0,local_3c0);
    GenerateServerMethodSignature
              ((Method *)uVar3,printer,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_f0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_f0);
    (*printer->_vptr_Printer[5])(printer);
    (*printer->_vptr_Printer[2])
              (printer,local_3c0,
               "return $Nil$status.Errorf(codes.Unimplemented, \"method $Method$ not implemented\")\n"
              );
    (*printer->_vptr_Printer[6])(printer);
    (*printer->_vptr_Printer[3])(printer,"}\n");
    (*printer->_vptr_Printer[3])(printer,"\n");
    if ((CommentHolder *)local_378._M_impl._0_8_ != (CommentHolder *)0x0) {
      (*(*(_func_int ***)local_378._M_impl._0_8_)[1])();
    }
  }
  (*printer->_vptr_Printer[2])
            (printer,local_3c0,
             "func (Unimplemented$Service$Server) mustEmbedUnimplemented$Service$Server() {}");
  (*printer->_vptr_Printer[3])(printer,"\n\n");
  (*printer->_vptr_Printer[2])(printer,p_Var1,"type Unsafe$Service$Server interface {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var1,"mustEmbedUnimplemented$Service$Server()\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  (*printer->_vptr_Printer[2])
            (printer,p_Var1,
             "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv $Service$Server) {\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var1,"s.RegisterService(&$ServiceDesc$, srv)\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n\n");
  uVar14 = 0;
  while (pSVar4 = local_318,
        iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318),
        p_Var1 = local_3c0, (int)uVar14 < iVar10) {
    local_310 = uVar14;
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])(&local_3b0,pSVar4,(ulong)uVar14);
    pCVar2 = local_3b0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_120,local_3c0);
    (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[5])(&local_378,pCVar2);
    exportName((string *)&local_3a8,(string *)&local_378);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Method",(allocator<char> *)&local_308);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,(key_type *)&local_348);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_378);
    (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0xb])
              ((string *)&local_3a8,pCVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Request",(allocator<char> *)&local_308);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,(key_type *)&local_348);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"CustomMethodIO",(allocator<char> *)&local_2b0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,(key_type *)&local_348);
    bVar6 = std::operator==(pmVar11,"");
    if (bVar6) {
      (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0xd])
                ((string *)&local_3a8,pCVar2);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"CustomMethodIO",&local_3b1);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_120,(key_type *)&local_280);
      std::__cxx11::string::string((string *)&local_3a8,(string *)pmVar11);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"Response",(allocator<char> *)&local_230);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,(key_type *)&local_308);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_3a8);
    if (!bVar6) {
      std::__cxx11::string::~string((string *)&local_280);
    }
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"ServicePrefix",&local_3c1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_230);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0,
                   "/",pmVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Service",&local_3b3);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_250);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0,
                   pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "/");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Method",&local_3b2);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_2d0);
    std::operator+((string *)&local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   pmVar11);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"FullMethodName",&local_309);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_1e0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"Service",(allocator<char> *)&local_1e0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_230);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0,
                   "_",pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0,
                   "_");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Method",&local_3c1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_250);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   pmVar11);
    std::operator+((string *)&local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   "_Handler");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Handler",&local_3b3);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_120,&local_2d0);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_230);
    iVar10 = (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0xf])(pCVar2);
    if ((char)iVar10 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"ServiceUnexported",(allocator<char> *)&local_250);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_120,(key_type *)&local_308);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"Method",(allocator<char> *)&local_2d0);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_120,(key_type *)&local_2b0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348
                     ,pmVar11,pmVar12);
      std::operator+((string *)&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348
                     ,"Server");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"StreamType",(allocator<char> *)&local_1e0);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_120,&local_230);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_308);
      (*printer->_vptr_Printer[2])
                (printer,&local_120,
                 "func $Handler$(srv interface{}, stream $grpc$.ServerStream) error {\n");
      (*printer->_vptr_Printer[5])(printer);
      bVar6 = ServerOnlyStreaming((Method *)pCVar2);
      p_Var13 = printer->_vptr_Printer[2];
      if (bVar6) {
        (*p_Var13)(printer,&local_120,"m := new($Request$)\n");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"Error_Check",(allocator<char> *)&local_348);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_120,(string *)&local_3a8);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_3a8,&local_120);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_3a8,false);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_3a8);
        p_Var13 = printer->_vptr_Printer[2];
        pcVar16 = "return srv.($Service$Server).$Method$(m, &$StreamType${stream})\n";
      }
      else {
        pcVar16 = "return srv.($Service$Server).$Method$(&$StreamType${stream})\n";
      }
      (*p_Var13)(printer,&local_120,pcVar16);
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
      iVar10 = (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])(pCVar2)
      ;
      bVar6 = true;
      if ((char)iVar10 == '\0') {
        bVar6 = ServerOnlyStreaming((Method *)pCVar2);
      }
      iVar10 = (*((CommentHolder *)&pCVar2->_vptr_CommentHolder)->_vptr_CommentHolder[0x12])(pCVar2)
      ;
      bVar7 = true;
      if ((char)iVar10 == '\0') {
        bVar7 = ClientOnlyStreaming((Method *)pCVar2);
      }
      bVar8 = ClientOnlyStreaming((Method *)pCVar2);
      (*printer->_vptr_Printer[2])(printer,&local_120,"type $Service$_$Method$Server interface {\n")
      ;
      (*printer->_vptr_Printer[5])(printer);
      if (bVar6 != false) {
        (*printer->_vptr_Printer[2])(printer,&local_120,"Send(*$Response$) error\n");
      }
      if (bVar7 != false) {
        (*printer->_vptr_Printer[2])(printer,&local_120,"Recv() (*$Request$, error)\n");
      }
      if (bVar8) {
        (*printer->_vptr_Printer[2])(printer,&local_120,"SendAndClose(*$Response$) error\n");
      }
      (*printer->_vptr_Printer[2])(printer,&local_120,"$grpc$.ServerStream\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
      (*printer->_vptr_Printer[2])(printer,&local_120,"type $StreamType$ struct {\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])(printer,&local_120,"$grpc$.ServerStream\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n\n");
      if (bVar6 != false) {
        (*printer->_vptr_Printer[2])
                  (printer,&local_120,"func (x *$StreamType$) Send(m *$Response$) error {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[3])(printer,"return x.ServerStream.SendMsg(m)\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
      }
      if (bVar7 != false) {
        (*printer->_vptr_Printer[2])
                  (printer,&local_120,"func (x *$StreamType$) Recv() (*$Request$, error) {\n");
        (*printer->_vptr_Printer[5])(printer);
        (*printer->_vptr_Printer[2])(printer,&local_120,"m := new($Request$)\n");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"Error_Check",(allocator<char> *)&local_308);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_120,(key_type *)&local_348);
        std::__cxx11::string::assign((char *)pmVar11);
        std::__cxx11::string::~string((string *)&local_348);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree(&local_348,&local_120);
        GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_348,true);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_348);
        (*printer->_vptr_Printer[3])(printer,"return m, nil\n");
        (*printer->_vptr_Printer[6])(printer);
        (*printer->_vptr_Printer[3])(printer,"}\n\n");
      }
      if (bVar8) {
        (*printer->_vptr_Printer[2])
                  (printer,&local_120,"func (x *$StreamType$) SendAndClose(m *$Response$) error {\n"
                  );
        (*printer->_vptr_Printer[5])(printer);
        pcVar15 = "return x.ServerStream.SendMsg(m)\n";
        pcVar16 = ")\n}\n\n";
        goto LAB_0024d00b;
      }
    }
    else {
      (*printer->_vptr_Printer[2])
                (printer,&local_120,
                 "func $Handler$(srv interface{}, ctx $context$.Context,\n\tdec func(interface{}) error, interceptor $grpc$.UnaryServerInterceptor) (interface{}, error) {\n"
                );
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])(printer,&local_120,"in := new($Request$)\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,"Error_Check",(allocator<char> *)&local_348);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_120,(string *)&local_3a8);
      std::__cxx11::string::assign((char *)pmVar11);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_3a8,&local_120);
      GenerateError(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_3a8,true);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_3a8);
      (*printer->_vptr_Printer[3])(printer,"if interceptor == nil {\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])
                (printer,&local_120,"return srv.($Service$Server).$Method$(ctx, in)\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n");
      (*printer->_vptr_Printer[2])(printer,&local_120,"info := &$grpc$.UnaryServerInfo{\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[3])(printer,"Server:     srv,\n");
      (*printer->_vptr_Printer[2])(printer,&local_120,"FullMethod: \"$FullMethodName$\",\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])
                (printer,&local_120,
                 "handler := func(ctx $context$.Context, req interface{}) (interface{}, error) {\n")
      ;
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])
                (printer,&local_120,"return srv.($Service$Server).$Method$(ctx, req.(*$Request$))\n"
                );
      (*printer->_vptr_Printer[6])(printer);
      pcVar16 = "\t\t}\n";
      (*printer->_vptr_Printer[3])(printer,"}\n");
      pcVar15 = "return interceptor(ctx, in, info, handler)\n";
LAB_0024d00b:
      (*printer->_vptr_Printer[3])(printer,pcVar15);
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,pcVar16 + 2);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_120);
    if (local_3b0 != (CommentHolder *)0x0) {
      (*((CommentHolder *)&local_3b0->_vptr_CommentHolder)->_vptr_CommentHolder[1])();
    }
    uVar14 = local_310 + 1;
  }
  (*printer->_vptr_Printer[2])(printer,local_3c0,"var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  (*printer->_vptr_Printer[2])(printer,p_Var1,"ServiceName: \"$ServicePrefix$$Service$\",\n");
  (*printer->_vptr_Printer[2])(printer,p_Var1,"HandlerType: (*$Service$Server)(nil),\n");
  (*printer->_vptr_Printer[2])(printer,p_Var1,"Methods: []$grpc$.MethodDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  for (uVar14 = 0; pSVar4 = local_318,
      iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318),
      (int)uVar14 < iVar10; uVar14 = uVar14 + 1) {
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])(&local_2d0,pSVar4,(ulong)uVar14);
    (*(*(_func_int ***)local_2d0._M_dataplus._M_p)[5])(&local_140);
    exportName((string *)&local_3a8,&local_140);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Method",(allocator<char> *)&local_378);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_348);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Service",(allocator<char> *)&local_1e0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,(key_type *)&local_2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "_",pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "_");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"Method",(allocator<char> *)&local_3b0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,&local_230);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   "_Handler");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Handler",&local_3c1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,&local_250);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2b0);
    iVar10 = (*(*(_func_int ***)local_2d0._M_dataplus._M_p)[0xf])();
    if ((char)iVar10 != '\0') {
      (*printer->_vptr_Printer[3])(printer,"{\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])(printer,local_3c0,"MethodName: \"$Method$\",\n");
      (*printer->_vptr_Printer[2])(printer,local_3c0,"Handler:    $Handler$,\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"},\n");
    }
    if ((CommentHolder *)local_2d0._M_dataplus._M_p != (CommentHolder *)0x0) {
      (*(*(_func_int ***)local_2d0._M_dataplus._M_p)[1])();
    }
  }
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"},\n");
  (*printer->_vptr_Printer[2])(printer,local_3c0,"Streams: []$grpc$.StreamDesc{\n");
  (*printer->_vptr_Printer[5])(printer);
  uVar14 = 0;
  do {
    pSVar4 = local_318;
    iVar10 = (*(local_318->super_CommentHolder)._vptr_CommentHolder[8])(local_318);
    if (iVar10 <= (int)uVar14) {
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"},\n");
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"}\n");
      return;
    }
    (*(pSVar4->super_CommentHolder)._vptr_CommentHolder[9])(&local_2d0,pSVar4,(ulong)uVar14);
    (*(*(_func_int ***)local_2d0._M_dataplus._M_p)[5])(&local_160);
    exportName((string *)&local_3a8,&local_160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"Method",(allocator<char> *)&local_378);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_348);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"Service",(allocator<char> *)&local_1e0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,(key_type *)&local_2b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "_",pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308,
                   "_");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"Method",(allocator<char> *)&local_3b0);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,&local_230);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378,
                   pmVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,
                   "_Handler");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Handler",&local_3c1);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3c0,&local_250);
    std::__cxx11::string::operator=((string *)pmVar11,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_2b0);
    cVar9 = (**(code **)((long)*(CommentHolder *)local_2d0._M_dataplus._M_p + 0x78))();
    if (cVar9 == '\0') {
      (*printer->_vptr_Printer[3])(printer,"{\n");
      (*printer->_vptr_Printer[5])(printer);
      (*printer->_vptr_Printer[2])(printer,local_3c0,"StreamName:    \"$Method$\",\n");
      (*printer->_vptr_Printer[2])(printer,local_3c0,"Handler:       $Handler$,\n");
      bVar6 = ClientOnlyStreaming((Method *)local_2d0._M_dataplus._M_p);
      if (bVar6) {
LAB_0024d59a:
        p_Var13 = printer->_vptr_Printer[3];
        pcVar16 = "ClientStreams: true,\n";
      }
      else {
        bVar6 = ServerOnlyStreaming((Method *)local_2d0._M_dataplus._M_p);
        p_Var13 = printer->_vptr_Printer[3];
        if (!bVar6) {
          (*p_Var13)(printer,"ServerStreams: true,\n");
          goto LAB_0024d59a;
        }
        pcVar16 = "ServerStreams: true,\n";
      }
      (*p_Var13)(printer,pcVar16);
      (*printer->_vptr_Printer[6])(printer);
      (*printer->_vptr_Printer[3])(printer,"},\n");
    }
    if ((CommentHolder *)local_2d0._M_dataplus._M_p != (CommentHolder *)0x0) {
      (*(*(_func_int ***)local_2d0._M_dataplus._M_p)[1])();
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void GenerateService(const grpc_generator::Service *service,
                     grpc_generator::Printer *printer,
                     std::map<grpc::string, grpc::string> vars) {
  vars["Service"] = exportName(service->name());
  // Client Interface
  printer->Print(vars, "// Client API for $Service$ service\n");
  printer->Print(vars, "type $Service$Client interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateClientMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Outdent();
  printer->Print("}\n\n");

  // Client structure
  vars["ServiceUnexported"] = unexportName(vars["Service"]);
  printer->Print(vars, "type $ServiceUnexported$Client struct {\n");
  printer->Indent();
  printer->Print(vars, "cc $grpc$.ClientConnInterface\n");
  printer->Outdent();
  printer->Print("}\n\n");

  // NewClient
  printer->Print(vars,
                 "func New$Service$Client(cc $grpc$.ClientConnInterface) "
                 "$Service$Client {\n");
  printer->Indent();
  printer->Print(vars, "return &$ServiceUnexported$Client{cc}");
  printer->Outdent();
  printer->Print("\n}\n\n");

  int unary_methods = 0, streaming_methods = 0;
  vars["ServiceDesc"] = "_" + vars["Service"] + "_serviceDesc";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    if (method->NoStreaming()) {
      vars["MethodDesc"] =
          vars["ServiceDesc"] + ".Method[" + as_string(unary_methods) + "]";
      unary_methods++;
    } else {
      vars["MethodDesc"] = vars["ServiceDesc"] + ".Streams[" +
                           as_string(streaming_methods) + "]";
      streaming_methods++;
    }
    GenerateClientMethod(method.get(), printer, vars);
  }

  // Server Interface
  printer->Print(vars, "// Server API for $Service$ service\n");
  printer->Print(vars, "type $Service$Server interface {\n");
  printer->Indent();
  vars["Ending"] = "\n";
  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethodSignature(service->method(i).get(), printer, vars);
  }
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");

  printer->Print(vars, "type Unimplemented$Service$Server struct {\n");
  printer->Print("}\n\n");

  vars["Ending"] = " {\n";
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Nil"] = method->NoStreaming() ? "nil, " : "";
    printer->Print(vars, "func (Unimplemented$Service$Server) ");
    GenerateServerMethodSignature(method.get(), printer, vars);
    printer->Indent();
    printer->Print(vars,
                   "return $Nil$status.Errorf(codes.Unimplemented, \"method "
                   "$Method$ not implemented\")\n");
    printer->Outdent();
    printer->Print("}\n");
    printer->Print("\n");
  }

  printer->Print(vars,
                 "func (Unimplemented$Service$Server) "
                 "mustEmbedUnimplemented$Service$Server() {}");
  printer->Print("\n\n");

  printer->Print(vars, "type Unsafe$Service$Server interface {\n");
  printer->Indent();
  printer->Print(vars, "mustEmbedUnimplemented$Service$Server()\n");
  printer->Outdent();
  printer->Print("}\n\n");
  // Server registration.
  printer->Print(vars,
                 "func Register$Service$Server(s $grpc$.ServiceRegistrar, srv "
                 "$Service$Server) {\n");
  printer->Indent();
  printer->Print(vars, "s.RegisterService(&$ServiceDesc$, srv)\n");
  printer->Outdent();
  printer->Print("}\n\n");

  for (int i = 0; i < service->method_count(); i++) {
    GenerateServerMethod(service->method(i).get(), printer, vars);
  }

  // Service Descriptor
  printer->Print(vars, "var $ServiceDesc$ = $grpc$.ServiceDesc{\n");
  printer->Indent();
  printer->Print(vars, "ServiceName: \"$ServicePrefix$$Service$\",\n");
  printer->Print(vars, "HandlerType: (*$Service$Server)(nil),\n");
  printer->Print(vars, "Methods: []$grpc$.MethodDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "MethodName: \"$Method$\",\n");
      printer->Print(vars, "Handler:    $Handler$,\n");
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Print(vars, "Streams: []$grpc$.StreamDesc{\n");
  printer->Indent();
  for (int i = 0; i < service->method_count(); i++) {
    auto method = service->method(i);
    vars["Method"] = exportName(method->name());
    vars["Handler"] = "_" + vars["Service"] + "_" + vars["Method"] + "_Handler";
    if (!method->NoStreaming()) {
      printer->Print("{\n");
      printer->Indent();
      printer->Print(vars, "StreamName:    \"$Method$\",\n");
      printer->Print(vars, "Handler:       $Handler$,\n");
      if (ClientOnlyStreaming(method.get())) {
        printer->Print("ClientStreams: true,\n");
      } else if (ServerOnlyStreaming(method.get())) {
        printer->Print("ServerStreams: true,\n");
      } else {
        printer->Print("ServerStreams: true,\n");
        printer->Print("ClientStreams: true,\n");
      }
      printer->Outdent();
      printer->Print("},\n");
    }
  }
  printer->Outdent();
  printer->Print("},\n");
  printer->Outdent();
  printer->Print("}\n");
}